

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStrategy.cpp
# Opt level: O2

int __thiscall
SimpleStrategy::countCalls
          (SimpleStrategy *this,
          set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *calls)

{
  _Base_ptr p_Var1;
  int iVar2;
  Call c;
  Call local_60;
  
  iVar2 = 0;
  for (p_Var1 = (calls->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(calls->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    CfgData::Call::Call(&local_60,(Call *)(p_Var1 + 1));
    iVar2 = iVar2 + (int)local_60.calls._M_t._M_impl.super__Rb_tree_header._M_node_count;
    CfgData::Call::~Call(&local_60);
  }
  return iVar2;
}

Assistant:

int SimpleStrategy::countCalls(const std::set<CfgData::Call>& calls) {
	int total = 0;
	for (CfgData::Call c : calls)
		total += c.calls.size();

	return total;
}